

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

void __thiscall
CVmObjHTTPRequest::load_from_image(CVmObjHTTPRequest *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  size_t in_RCX;
  char *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  vm_obj_id_t obj_id;
  CVmObjTable *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  
  obj_id = (vm_obj_id_t)((ulong)in_RDI >> 0x20);
  load_image_data((CVmObjHTTPRequest *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,in_RCX);
  CVmObjTable::save_image_pointer
            (unaff_retaddr,obj_id,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(size_t)in_RDX)
  ;
  return;
}

Assistant:

void CVmObjHTTPRequest::load_from_image(VMG_ vm_obj_id_t self,
                                        const char *ptr, size_t siz)
{
    /* load our image data */
    load_image_data(vmg_ ptr, siz);

    /* 
     *   save our image data pointer in the object table, so that we can
     *   access it (without storing it ourselves) during a reload 
     */
    G_obj_table->save_image_pointer(self, ptr, siz);
}